

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  MapValueRef *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  CppType CVar4;
  uint32 uVar5;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  string local_68;
  MapValueRef *local_48;
  MapKey *local_40;
  allocator local_31;
  
  local_48 = val;
  local_40 = key;
  bVar2 = FieldDescriptor::is_map(field);
  if (!bVar2) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"InsertOrLookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  std::__cxx11::string::string((string *)&local_68,"value",&local_31);
  this_01 = Descriptor::FindFieldByName(this_00,&local_68);
  CVar4 = FieldDescriptor::cpp_type(this_01);
  pMVar1 = local_48;
  local_48->type_ = CVar4;
  std::__cxx11::string::~string((string *)&local_68);
  uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar3 = (**(code **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar5) + 0x18))
                    ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5,local_40,
                     pMVar1);
  return (bool)uVar3;
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}